

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawBorder
          (QTextDocumentLayoutPrivate *this,QPainter *painter,QRectF *rect,qreal topMargin,
          qreal bottomMargin,qreal border,QBrush *brush,BorderStyle style)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  RenderHints RVar4;
  BorderStyle style_00;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int page;
  int iVar8;
  double dVar7;
  QSizeF QVar9;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  QRectF local_a8;
  BorderPaginator local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  auVar6._0_8_ = QVar9.ht;
  page = 0;
  iVar8 = 0;
  if (0.0 < auVar6._0_8_) {
    auVar5._8_8_ = rect->h + rect->yp + border;
    auVar5._0_8_ = rect->yp;
    auVar6._8_8_ = auVar6._0_8_;
    auVar5 = divpd(auVar5,auVar6);
    page = (int)auVar5._0_8_;
    iVar8 = (int)auVar5._8_8_;
  }
  local_80.rect.xp = rect->xp;
  local_80.rect.yp = rect->yp;
  local_80.rect.w = rect->w;
  local_80.rect.h = rect->h;
  local_80.pageHeight = auVar6._0_8_;
  local_80.topMarginAfterPageBreak = topMargin;
  local_80.bottomMargin = bottomMargin;
  local_80.border = border;
  local_80.topPage = page;
  local_80.bottomPage = iVar8;
  RVar4 = QPainter::renderHints(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  if (page <= iVar8) {
    style_00 = style + BorderStyle_Dotted;
    do {
      local_a8.w._0_4_ = 0xffffffff;
      local_a8.w._4_4_ = 0xffffffff;
      local_a8.h._0_4_ = 0xffffffff;
      local_a8.h._4_4_ = 0xffffffff;
      local_a8.xp._0_4_ = 0xffffffff;
      local_a8.xp._4_4_ = 0xffffffff;
      local_a8.yp._0_4_ = 0xffffffff;
      local_a8.yp._4_4_ = 0xffffffff;
      BorderPaginator::clipRect(&local_a8,&local_80,page);
      if (0.0 < (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_)) {
        dVar3 = (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_);
        if (0.0 < dVar3) {
          dVar2 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
          dVar7 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
          QBrush::QBrush((QBrush *)local_b0,brush);
          qDrawEdge(painter,dVar2,dVar7,dVar2 + border,dVar3 + dVar7 + border,0.0,0.0,LeftEdge,
                    style_00,(QBrush)local_b0);
          QBrush::~QBrush((QBrush *)local_b0);
          dVar3 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
          dVar2 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
          dVar7 = (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
          QBrush::QBrush((QBrush *)local_b8,brush);
          qDrawEdge(painter,dVar3 + border,dVar2,dVar3 + dVar7 + border,dVar2 + border,0.0,0.0,
                    TopEdge,style_00,(QBrush)local_b8);
          QBrush::~QBrush((QBrush *)local_b8);
          dVar3 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_);
          dVar7 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_) +
                  (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
          dVar2 = (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_);
          QBrush::QBrush((QBrush *)local_c0,brush);
          qDrawEdge(painter,dVar7,dVar3 + border,dVar7 + border,dVar3 + dVar2,0.0,0.0,RightEdge,
                    style_00,(QBrush)local_c0);
          QBrush::~QBrush((QBrush *)local_c0);
          dVar3 = (double)CONCAT44(local_a8.xp._4_4_,local_a8.xp._0_4_);
          dVar7 = (double)CONCAT44(local_a8.yp._4_4_,local_a8.yp._0_4_) +
                  (double)CONCAT44(local_a8.h._4_4_,local_a8.h._0_4_);
          dVar2 = (double)CONCAT44(local_a8.w._4_4_,local_a8.w._0_4_);
          QBrush::QBrush((QBrush *)local_c8,brush);
          qDrawEdge(painter,dVar3 + border,dVar7,dVar3 + dVar2 + border,dVar7 + border,0.0,0.0,
                    BottomEdge,style_00,(QBrush)local_c8);
          QBrush::~QBrush((QBrush *)local_c8);
        }
      }
      bVar1 = page < local_80.bottomPage;
      page = page + 1;
    } while (bVar1);
  }
  if (((uint)RVar4.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
             super_QFlagsStorage<QPainter::RenderHint>.i & 1) == 0) {
    QPainter::setRenderHint(painter,Antialiasing,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawBorder(QPainter *painter, const QRectF &rect, qreal topMargin, qreal bottomMargin,
                                            qreal border, const QBrush &brush, QTextFrameFormat::BorderStyle style) const
{
    BorderPaginator paginator(document, rect, topMargin, bottomMargin, border);

#ifndef QT_NO_CSSPARSER
    QCss::BorderStyle cssStyle = static_cast<QCss::BorderStyle>(style + 1);
#else
    Q_UNUSED(style);
#endif //QT_NO_CSSPARSER

    bool turn_off_antialiasing = !(painter->renderHints() & QPainter::Antialiasing);
    painter->setRenderHint(QPainter::Antialiasing);

    for (int i = paginator.topPage; i <= paginator.bottomPage; ++i) {
        QRectF clipped = paginator.clipRect(i);
        if (!clipped.isValid())
            continue;

#ifndef QT_NO_CSSPARSER
        qDrawEdge(painter, clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border, 0, 0, QCss::LeftEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border, 0, 0, QCss::TopEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom(), 0, 0, QCss::RightEdge, cssStyle, brush);
        qDrawEdge(painter, clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border, 0, 0, QCss::BottomEdge, cssStyle, brush);
#else
        painter->save();
        painter->setPen(Qt::NoPen);
        painter->setBrush(brush);
        painter->drawRect(QRectF(clipped.left(), clipped.top(), clipped.left() + border, clipped.bottom() + border));
        painter->drawRect(QRectF(clipped.left() + border, clipped.top(), clipped.right() + border, clipped.top() + border));
        painter->drawRect(QRectF(clipped.right(), clipped.top() + border, clipped.right() + border, clipped.bottom()));
        painter->drawRect(QRectF(clipped.left() + border, clipped.bottom(), clipped.right() + border, clipped.bottom() + border));
        painter->restore();
#endif //QT_NO_CSSPARSER
    }
    if (turn_off_antialiasing)
        painter->setRenderHint(QPainter::Antialiasing, false);
}